

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O3

bool InfoListWnd::ToggleDisplay(int _force)

{
  bool bVar1;
  InfoListWnd *this;
  
  if (_force == 0) {
    if (gpILW != (InfoListWnd *)0x0) {
      bVar1 = ImgWindow::GetVisible((ImgWindow *)gpILW);
      if (bVar1) goto LAB_00143e4f;
      goto LAB_00143e2c;
    }
  }
  else {
    if (_force < 1) {
LAB_00143e4f:
      if (gpILW != (InfoListWnd *)0x0) {
        (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
      }
      return false;
    }
LAB_00143e2c:
    if (gpILW != (InfoListWnd *)0x0) goto LAB_00143e86;
  }
  this = (InfoListWnd *)operator_new(0x300);
  InfoListWnd(this,WND_MODE_FLOAT_CNT_VR);
  gpILW = this;
LAB_00143e86:
  (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpILW,1);
  XPLMBringWindowToFront((gpILW->super_LTImgWindow).super_ImgWindow.mWindowID);
  return true;
}

Assistant:

bool InfoListWnd::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = InfoListWnd::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpILW)
            gpILW = new InfoListWnd();
        // Ensure it is visible
        gpILW->SetVisible(true);
        gpILW->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpILW)                      // just remove the object
            delete gpILW;               // (destructor clears gpILW)
        return false;                   // not visible
    }
}